

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_short,_3U>::getSFloat
          (ImageT<unsigned_short,_3U> *this,uint32_t numChannels,uint32_t targetBits)

{
  undefined8 uVar1;
  unsigned_short *puVar2;
  uchar *puVar3;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  float outValue_1;
  uint16_t outValue;
  uchar *target;
  unsigned_short value;
  uint32_t c;
  uint32_t x;
  uint32_t y;
  uint32_t targetBytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  ushort local_82;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 uVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  float local_50;
  uint16_t local_4a;
  ushort *local_48;
  ushort local_3a;
  uint local_38;
  uint local_34;
  uint local_30;
  undefined1 local_1d;
  uint local_1c;
  uint local_14;
  
  if (3 < in_EDX) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38e,
                  "virtual std::vector<uint8_t> ImageT<unsigned short, 3>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned short, componentCount = 3]"
                 );
  }
  uVar4 = in_ECX == 0x10 || in_ECX == 0x20;
  if (in_ECX == 0x10 || in_ECX == 0x20) {
    local_1c = in_ECX >> 3;
    local_1d = 0;
    uVar1 = 0;
    this_00 = in_RDI;
    local_14 = in_EDX;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x14035f);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (this_00,(size_type)in_RDI,(allocator_type *)CONCAT17(uVar4,in_stack_ffffffffffffff90)
              );
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x14037f);
    for (local_30 = 0; local_30 < *(uint *)(in_RSI + 0xc); local_30 = local_30 + 1) {
      for (local_34 = 0; local_34 < *(uint *)(in_RSI + 8); local_34 = local_34 + 1) {
        for (local_38 = 0; local_38 < local_14; local_38 = local_38 + 1) {
          if (local_38 < 3) {
            puVar2 = color<unsigned_short,_3U>::operator[]
                               ((color<unsigned_short,_3U> *)
                                (*(long *)(in_RSI + 0x18) +
                                (ulong)(local_30 * *(int *)(in_RSI + 8) + local_34) * 6),local_38);
            local_82 = *puVar2;
          }
          else {
            local_82 = (ushort)(local_38 == 3);
          }
          local_3a = local_82;
          puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x14042b);
          local_48 = (ushort *)
                     (puVar3 + (local_30 * *(int *)(in_RSI + 8) * local_14 + local_34 * local_14 +
                               local_38) * local_1c);
          if (local_1c == 2) {
            *local_48 = local_3a;
          }
          else if (local_1c == 2) {
            local_4a = imageio::float_to_half((float)((ulong)uVar1 >> 0x20));
            memcpy(local_48,&local_4a,(ulong)local_1c);
          }
          else if (local_1c == 4) {
            local_50 = (float)local_3a;
            memcpy(local_48,&local_50,4);
          }
        }
      }
    }
    return this_00;
  }
  __assert_fail("targetBits == 16 || targetBits == 32",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x38f,
                "virtual std::vector<uint8_t> ImageT<unsigned short, 3>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned short, componentCount = 3]"
               );
}

Assistant:

virtual std::vector<uint8_t> getSFloat(uint32_t numChannels, uint32_t targetBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 16 || targetBits == 32);

        const uint32_t targetBytes = targetBits / 8;
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto value = c < componentCount ? pixels[y * width + x][c] : (c != 3 ? componentType{0} : componentType{1});
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (sizeof(componentType) == targetBytes) {
                        *reinterpret_cast<componentType*>(target) = value;
                    } else if (targetBytes == 2) {
                        const auto outValue = imageio::float_to_half(static_cast<float>(value));
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<float>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    }
                }
            }
        }

        return data;
    }